

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_packsize(lua_State *L)

{
  KOption KVar1;
  long lVar2;
  long lVar3;
  ulong totalsize;
  int ntoalign;
  int local_4c;
  char *fmt;
  Header h;
  
  totalsize = 0;
  fmt = luaL_checklstring(L,1,(size_t *)0x0);
  h.islittle = 1;
  h.maxalign = 1;
  h.L = L;
  while (*fmt != '\0') {
    KVar1 = getdetails(&h,totalsize,&fmt,&local_4c,&ntoalign);
    lVar2 = (long)ntoalign;
    lVar3 = (long)local_4c;
    if (0x7fffffffU - (lVar3 + lVar2) < totalsize) {
      luaL_argerror(L,1,"format result too large");
    }
    if ((KVar1 & (Knop|Kpadding)) == Kstring) {
      luaL_argerror(L,1,"variable-length format");
    }
    totalsize = totalsize + lVar3 + lVar2;
  }
  lua_pushinteger(L,totalsize);
  return 1;
}

Assistant:

static int str_packsize(lua_State *L) {
    Header h;
    const char *fmt = luaL_checkstring(L, 1);  /* format string */
    size_t totalsize = 0;  /* accumulate total size of result */
    initheader(L, &h);
    while (*fmt != '\0') {
        int size, ntoalign;
        KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
        size += ntoalign;  /* total space used by option */
        luaL_argcheck(L, totalsize <= MAXSIZE - size, 1,
                      "format result too large");
        totalsize += size;
        switch (opt) {
            case Kstring:  /* strings with length count */
            case Kzstr:    /* zero-terminated string */
                luaL_argerror(L, 1, "variable-length format");
                /* call never return, but to avoid warnings: *//* FALLTHROUGH */
            default:
                break;
        }
    }
    lua_pushinteger(L, (lua_Integer) totalsize);
    return 1;
}